

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O0

BBox<3> * Omega_h::find_bounding_box<3>(BBox<3> *__return_storage_ptr__,Reals *coords)

{
  undefined8 in_R8;
  undefined8 in_R9;
  Read<double> local_110;
  GetBBoxOp<3> local_100;
  undefined8 local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  int local_b4;
  undefined8 local_b0;
  undefined8 uStack_a8;
  Int i;
  BBox<3> init;
  int npts;
  Reals *coords_local;
  ulong local_10;
  
  if (((ulong)(coords->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((coords->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(coords->write_).shared_alloc_.alloc >> 3;
  }
  local_b4 = divide_no_remainder<int>((int)(local_10 >> 3),3);
  for (local_b0._4_4_ = 0; local_b0._4_4_ < 3; local_b0._4_4_ = local_b0._4_4_ + 1) {
    init.min.super_Few<double,_3>.array_[(long)local_b0._4_4_ + -1] = 1.79769313486232e+308;
    init.min.super_Few<double,_3>.array_[(long)local_b0._4_4_ + 2] = -1.79769313486232e+308;
  }
  local_b0._0_4_ = (Omega_h *)0x0;
  local_c8 = init.max.super_Few<double,_3>.array_[0];
  dStack_c0 = init.max.super_Few<double,_3>.array_[1];
  local_d8 = init.min.super_Few<double,_3>.array_[1];
  dStack_d0 = init.min.super_Few<double,_3>.array_[2];
  local_e8 = uStack_a8;
  dStack_e0 = init.min.super_Few<double,_3>.array_[0];
  init.max.super_Few<double,_3>.array_[2]._4_4_ = local_b4;
  Read<double>::Read(&local_110,coords);
  GetBBoxOp<3>::GetBBoxOp(&local_100,&local_110);
  transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<3>,Omega_h::BBox<3>,Omega_h::UniteOp<3>>
            (__return_storage_ptr__,(Omega_h *)local_b0,local_b4,&local_100,in_R8,in_R9,
             (undefined4)local_e8,dStack_e0._0_4_,local_d8._0_4_,dStack_d0._0_4_,local_c8._0_4_,
             dStack_c0._0_4_);
  GetBBoxOp<3>::~GetBBoxOp(&local_100);
  Read<double>::~Read(&local_110);
  return __return_storage_ptr__;
}

Assistant:

BBox<dim> find_bounding_box(Reals coords) {
  auto npts = divide_no_remainder(coords.size(), dim);
  BBox<dim> init;
  for (Int i = 0; i < dim; ++i) {
    init.min[i] = ArithTraits<Real>::max();
    init.max[i] = ArithTraits<Real>::min();
  }
  return transform_reduce(IntIterator(0), IntIterator(npts), init,
      UniteOp<dim>(), GetBBoxOp<dim>(coords));
}